

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexPermuteTwo(Abc_Cex_t *p,Vec_Int_t *vPermOld,Vec_Int_t *vPermNew)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vMapOld2New;
  int *__s;
  Abc_Cex_t *pAVar4;
  int i;
  
  iVar1 = vPermOld->nSize;
  if (iVar1 != p->nPis) {
    __assert_fail("Vec_IntSize(vPermOld) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x208,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vPermNew->nSize == iVar1) {
    vMapOld2New = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar3 = iVar1;
    }
    vMapOld2New->nCap = iVar3;
    i = 0;
    if (iVar3 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar3 << 2);
    }
    vMapOld2New->pArray = __s;
    vMapOld2New->nSize = iVar1;
    memset(__s,0xff,(long)iVar1 << 2);
    iVar3 = iVar1;
    while( true ) {
      if (iVar3 <= i) {
        pAVar4 = Abc_CexPermute(p,vMapOld2New);
        free(__s);
        free(vMapOld2New);
        return pAVar4;
      }
      uVar2 = Vec_IntEntry(vPermOld,i);
      iVar3 = Vec_IntEntry(vPermNew,i);
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) break;
      __s[uVar2] = iVar3;
      i = i + 1;
      iVar3 = vPermOld->nSize;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("Vec_IntSize(vPermNew) == p->nPis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                ,0x209,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Abc_CexPermuteTwo( Abc_Cex_t * p, Vec_Int_t * vPermOld, Vec_Int_t * vPermNew )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vPerm;
    int i, eOld, eNew;
    assert( Vec_IntSize(vPermOld) == p->nPis );
    assert( Vec_IntSize(vPermNew) == p->nPis );
    vPerm = Vec_IntStartFull( p->nPis );
    Vec_IntForEachEntryTwo( vPermOld, vPermNew, eOld, eNew, i )
        Vec_IntWriteEntry( vPerm, eOld, eNew );
    pCex = Abc_CexPermute( p, vPerm );
    Vec_IntFree( vPerm );
    return pCex;
}